

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::ParamSpec::InternalSwap(ParamSpec *this,ParamSpec *other)

{
  float fVar1;
  int iVar2;
  uint32 uVar3;
  string *psVar4;
  void *pvVar5;
  UnknownFieldSet *other_00;
  
  psVar4 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar4;
  iVar2 = this->share_mode_;
  this->share_mode_ = other->share_mode_;
  other->share_mode_ = iVar2;
  fVar1 = this->lr_mult_;
  this->lr_mult_ = other->lr_mult_;
  other->lr_mult_ = fVar1;
  fVar1 = this->decay_mult_;
  this->decay_mult_ = other->decay_mult_;
  other->decay_mult_ = fVar1;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  pvVar5 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar5 & 1) == 0) goto LAB_0048ef9f;
LAB_0048ef92:
    other_00 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar5 & 1) != 0) goto LAB_0048ef92;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_0048ef9f:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void ParamSpec::InternalSwap(ParamSpec* other) {
  name_.Swap(&other->name_);
  std::swap(share_mode_, other->share_mode_);
  std::swap(lr_mult_, other->lr_mult_);
  std::swap(decay_mult_, other->decay_mult_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}